

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<128U,_unsigned_int,_void,_false>
math::wide_integer::pow<int,128u,unsigned_int,void,false>
          (uintwide_t<128U,_unsigned_int,_void,_false> *b,int *p)

{
  value_type_conflict *this;
  representation_type rVar1;
  bool local_7d;
  uintwide_t<128U,_unsigned_int,_void,_false> local_7c;
  undefined1 local_6c [8];
  local_wide_integer_type p_local;
  local_wide_integer_type y;
  value_type_conflict local_44 [2];
  uintwide_t<128U,_unsigned_int,_void,_false> *local_3c;
  value_type_conflict local_34 [2];
  uint local_2c;
  uint *puStack_28;
  local_limb_type p0;
  int *p_local_1;
  uintwide_t<128U,_unsigned_int,_void,_false> *b_local;
  local_wide_integer_type result;
  
  puStack_28 = (uint *)p;
  p_local_1 = (int *)b;
  uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)&b_local);
  local_2c = *puStack_28;
  if ((local_2c == 0) && (*puStack_28 == 0)) {
    uintwide_t<128u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
    enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std
    ::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::digits),void>::
    type__(&local_3c,'\x01',
           (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
            *)0x0);
    b_local = local_3c;
    result.values.super_array<unsigned_int,_4UL>.elems[0] = local_34[0];
    result.values.super_array<unsigned_int,_4UL>.elems[1] = local_34[1];
  }
  else if ((local_2c == 1) && (*puStack_28 == 1)) {
    b_local = *(uintwide_t<128U,_unsigned_int,_void,_false> **)p_local_1;
    result.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)(p_local_1 + 2);
  }
  else if ((local_2c == 2) && (*puStack_28 == 2)) {
    b_local = *(uintwide_t<128U,_unsigned_int,_void,_false> **)p_local_1;
    result.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)(p_local_1 + 2);
    uintwide_t<128U,_unsigned_int,_void,_false>::operator*=
              ((uintwide_t<128U,_unsigned_int,_void,_false> *)&b_local,
               (uintwide_t<128U,_unsigned_int,_void,_false> *)p_local_1);
  }
  else {
    uintwide_t<128u,unsigned_int,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
    enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std
    ::numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_int>::digits),void>::
    type__(y.values.super_array<unsigned_int,_4UL>.elems + 2,'\x01',
           (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
            *)0x0);
    b_local = (uintwide_t<128U,_unsigned_int,_void,_false> *)
              y.values.super_array<unsigned_int,_4UL>.elems._8_8_;
    result.values.super_array<unsigned_int,_4UL>.elems._0_8_ = local_44;
    p_local.values.super_array<unsigned_int,_4UL>.elems._8_8_ = *(undefined8 *)p_local_1;
    y.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)(p_local_1 + 2);
    uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
              ((uintwide_t<128U,_unsigned_int,_void,_false> *)local_6c,*puStack_28,
               (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0);
    while( true ) {
      local_2c = uintwide_t::operator_cast_to_unsigned_int((uintwide_t *)local_6c);
      local_7d = true;
      if (local_2c == 0) {
        uintwide_t<128U,_unsigned_int,_void,_false>::uintwide_t<int>
                  (&local_7c,0,
                   (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *)0x0)
        ;
        local_7d = uintwide_t<128U,_unsigned_int,_void,_false>::operator!=
                             ((uintwide_t<128U,_unsigned_int,_void,_false> *)local_6c,&local_7c);
      }
      if (local_7d == false) break;
      if ((local_2c & 1) != 0) {
        uintwide_t<128U,_unsigned_int,_void,_false>::operator*=
                  ((uintwide_t<128U,_unsigned_int,_void,_false> *)&b_local,
                   (uintwide_t<128U,_unsigned_int,_void,_false> *)
                   (p_local.values.super_array<unsigned_int,_4UL>.elems + 2));
      }
      this = p_local.values.super_array<unsigned_int,_4UL>.elems + 2;
      uintwide_t<128U,_unsigned_int,_void,_false>::operator*=
                ((uintwide_t<128U,_unsigned_int,_void,_false> *)this,
                 (uintwide_t<128U,_unsigned_int,_void,_false> *)this);
      uintwide_t<128u,unsigned_int,void,false>::operator>>=
                ((uintwide_t<128u,unsigned_int,void,false> *)local_6c,1);
    }
  }
  rVar1.super_array<unsigned_int,_4UL>.elems[2] =
       result.values.super_array<unsigned_int,_4UL>.elems[0];
  rVar1.super_array<unsigned_int,_4UL>.elems[3] =
       result.values.super_array<unsigned_int,_4UL>.elems[1];
  rVar1.super_array<unsigned_int,_4UL>.elems._0_8_ = b_local;
  return (representation_type)(representation_type)rVar1.super_array<unsigned_int,_4UL>.elems;
}

Assistant:

constexpr auto pow(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& b, const OtherIntegralTypeP& p) -> uintwide_t<Width2, LimbType, AllocatorType, IsSigned>
  {
    // Calculate (b ^ p).
    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_limb_type         = typename local_wide_integer_type::limb_type;

    local_wide_integer_type result;
    auto p0 = static_cast<local_limb_type>(p);

    if((p0 == static_cast<local_limb_type>(UINT8_C(0))) && (p == static_cast<OtherIntegralTypeP>(0)))
    {
      result = local_wide_integer_type(static_cast<std::uint8_t>(UINT8_C(1)));
    }
    else if((p0 == static_cast<local_limb_type>(UINT8_C(1))) && (p == static_cast<OtherIntegralTypeP>(UINT8_C(1))))
    {
      result = b;
    }
    else if((p0 == static_cast<local_limb_type>(UINT8_C(2))) && (p == static_cast<OtherIntegralTypeP>(UINT8_C(2))))
    {
      result  = b;
      result *= b;
    }
    else
    {
      result = local_wide_integer_type(static_cast<std::uint8_t>(UINT8_C(1)));

      local_wide_integer_type y      (b);
      local_wide_integer_type p_local(p);

      while(((p0 = static_cast<local_limb_type>(p_local)) != static_cast<local_limb_type>(UINT8_C(0))) || (p_local != static_cast<local_wide_integer_type>(UINT8_C(0)))) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(p0 & static_cast<local_limb_type>(UINT8_C(1))) != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          result *= y;
        }

        y *= y;

        p_local >>= 1U;
      }
    }

    return result;
  }